

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleVertex.cpp
# Opt level: O2

void __thiscall SimpleVertex::transform(SimpleVertex *this,array<double,_16UL> *matrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  dVar1 = multiply(this,matrix,0xc);
  dVar2 = multiply(this,matrix,0);
  dVar3 = multiply(this,matrix,4);
  dVar4 = multiply(this,matrix,8);
  auVar5._8_8_ = dVar3;
  auVar5._0_8_ = dVar2;
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  auVar6 = divpd(auVar5,auVar6);
  this->x = (double)auVar6._0_8_;
  this->y = (double)auVar6._8_8_;
  this->z = dVar4 / dVar1;
  return;
}

Assistant:

void SimpleVertex::transform(const std::array<double, 16> &matrix) {
    double new_w = multiply(matrix, 12);
    double new_x = multiply(matrix, 0) / new_w;
    double new_y = multiply(matrix, 4) / new_w;
    double new_z = multiply(matrix, 8) / new_w;

    x = new_x;
    y = new_y;
    z = new_z;
}